

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

void gmlc::utilities::stringOps::trimString(string *input,string_view whitespace)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  size_type in_RDI;
  size_type unaff_retaddr;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_00000008;
  size_type in_stack_ffffffffffffffe0;
  size_type __pos;
  
  std::__cxx11::string::find_last_not_of<std::basic_string_view<char,std::char_traits<char>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)input,
             in_stack_00000008,unaff_retaddr);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (in_RSI,in_RDI,in_stack_ffffffffffffffe0);
  __pos = in_RDI;
  std::__cxx11::string::find_first_not_of<std::basic_string_view<char,std::char_traits<char>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)input,
             in_stack_00000008,unaff_retaddr);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (in_RSI,__pos,in_RDI);
  return;
}

Assistant:

void trimString(std::string& input, std::string_view whitespace)
    {
        input.erase(input.find_last_not_of(whitespace) + 1);
        input.erase(0, input.find_first_not_of(whitespace));
    }